

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O0

int64_t __thiscall AviWriter::TellFile64(AviWriter *this,FILE *fid)

{
  FILE *fid_local;
  AviWriter *this_local;
  
  if (fid == (FILE *)0x0) {
    this_local = (AviWriter *)0xffffffffffffffff;
  }
  else {
    clearerr((FILE *)fid);
    fflush((FILE *)fid);
    this_local = (AviWriter *)ftello((FILE *)fid);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t AviWriter::TellFile64(FILE *fid)
{
    if (fid == NULL) return -1;

    clearerr(fid);
    fflush(fid);
#if (defined(__WIN32__) || defined(_WIN32)) && !defined(_WIN32_WCE)
    return _telli64(_fileno(fid));
#else
#if defined(_WIN32_WCE)
    return ftell(fid);
#else
    return ftello(fid);
#endif
#endif
}